

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

PortConnection * __thiscall
slang::ast::anon_unknown_0::PortConnectionBuilder::implicitNamedPort<slang::ast::MultiPortSymbol>
          (PortConnectionBuilder *this,MultiPortSymbol *port,
          span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes,
          SourceRange range,bool isWildcard)

{
  undefined8 uVar1;
  undefined4 uVar2;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  optional<bool> oVar3;
  Diagnostic *pDVar4;
  PortConnection *pPVar5;
  char *pcVar6;
  LookupLocation target;
  string_view name;
  Symbol *symbol;
  SourceRange local_40;
  Symbol *local_30;
  
  local_40.endLoc = range.endLoc;
  local_40.startLoc = range.startLoc;
  pcVar6 = (char *)0x4004;
  if (((this->instance->body->flags).m_bits & 2) == 0) {
    pcVar6 = (char *)((ulong)isWildcard << 2);
  }
  name._M_str = pcVar6;
  name._M_len = (size_t)(port->super_Symbol).name._M_str;
  local_30 = Lookup::unqualified((Lookup *)this->scope,(Scope *)(port->super_Symbol).name._M_len,
                                 name,(bitmask<slang::ast::LookupFlags>)range.startLoc._0_4_);
  if (local_30 != (Symbol *)0x0) {
    uVar1 = (this->lookupLocation).scope;
    uVar2 = (this->lookupLocation).index;
    target.index = uVar2;
    target.scope = (Scope *)uVar1;
    target._12_4_ = 0;
    oVar3 = Symbol::isDeclaredBefore(local_30,target);
    if (((ushort)oVar3.super__Optional_base<bool,_true,_true>._M_payload.
                 super__Optional_payload_base<bool> & 1) == 0 &&
        ((ushort)oVar3.super__Optional_base<bool,_true,_true>._M_payload.
                 super__Optional_payload_base<bool> >> 8 & 1) != 0) {
      sourceRange.endLoc = local_40.endLoc;
      sourceRange.startLoc = local_40.startLoc;
      pDVar4 = Scope::addDiag(this->scope,(DiagCode)0x3e000a,sourceRange);
      Diagnostic::operator<<(pDVar4,(port->super_Symbol).name);
      Diagnostic::addNote(pDVar4,(DiagCode)0x50001,local_30->location);
    }
    pPVar5 = BumpAllocator::
             emplace<slang::ast::PortConnection,slang::ast::MultiPortSymbol_const&,slang::ast::Symbol_const*&,slang::SourceRange&>
                       (&this->comp->super_BumpAllocator,port,&local_30,&local_40);
    if (attributes._M_extent._M_extent_value._M_extent_value != 0) {
      Compilation::setAttributes(this->comp,pPVar5,attributes);
    }
    return pPVar5;
  }
  sourceRange_00.endLoc = local_40.endLoc;
  sourceRange_00.startLoc = local_40.startLoc;
  pDVar4 = Scope::addDiag(this->scope,(DiagCode)0x480006,sourceRange_00);
  Diagnostic::operator<<(pDVar4,(port->super_Symbol).name);
  pPVar5 = BumpAllocator::emplace<slang::ast::PortConnection,slang::ast::MultiPortSymbol_const&>
                     (&this->comp->super_BumpAllocator,port);
  return pPVar5;
}

Assistant:

PortConnection* implicitNamedPort(const TPort& port,
                                      std::span<const AttributeSymbol* const> attributes,
                                      SourceRange range, bool isWildcard) {
        // An implicit named port connection is semantically equivalent to `.port(port)` except:
        // - Can't create implicit net declarations this way
        // - Port types need to be equivalent, not just assignment compatible
        // - An implicit connection between nets of two dissimilar net types shall issue an
        //   error when it is a warning in an explicit named port connection

        bitmask<LookupFlags> flags;
        if (isWildcard)
            flags |= LookupFlags::DisallowWildcardImport;

        if (instance.body.flags.has(InstanceFlags::FromBind))
            flags |= LookupFlags::DisallowWildcardImport | LookupFlags::DisallowUnitReferences;

        auto symbol = Lookup::unqualified(scope, port.name, flags);
        if (!symbol) {
            // If this is a wildcard connection, we're allowed to use the port's default value,
            // if it has one.
            if (isWildcard && port.hasInitializer() && port.direction == ArgumentDirection::In)
                return defaultConnection(port, attributes);

            scope.addDiag(diag::ImplicitNamedPortNotFound, range) << port.name;
            return emptyConnection(port);
        }

        if (!symbol->isDeclaredBefore(lookupLocation).value_or(true)) {
            auto& diag = scope.addDiag(diag::UsedBeforeDeclared, range);
            diag << port.name;
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
        }

        auto conn = comp.emplace<PortConnection>(port, symbol, range);
        if (!attributes.empty())
            comp.setAttributes(*conn, attributes);

        return conn;
    }